

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileTargetGeneratorObjectStrings::~cmMakefileTargetGeneratorObjectStrings
          (cmMakefileTargetGeneratorObjectStrings *this)

{
  std::__cxx11::string::~string((string *)&this->NextObject);
  std::__cxx11::string::~string((string *)&this->CurrentString);
  return;
}

Assistant:

cmMakefileTargetGeneratorObjectStrings(std::vector<std::string>& strings,
                                         cmOutputConverter* outputConverter,
                                         bool useWatcomQuote,
                                         cmStateDirectory const& stateDir,
                                         std::string::size_type limit)
    : Strings(strings)
    , OutputConverter(outputConverter)
    , UseWatcomQuote(useWatcomQuote)
    , StateDir(stateDir)
    , LengthLimit(limit)
  {
    this->Space = "";
  }